

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void AddTriangles(Level *Lvl)

{
  int iVar1;
  Triangle *in_RDI;
  double dVar2;
  int lc;
  int c;
  Triangle *Tri;
  int local_18;
  int local_14;
  double *local_10;
  
  for (local_10 = *(double **)in_RDI[2].EdgeFlags; local_10 != (double *)0x0;
      local_10 = (double *)local_10[5]) {
    local_14 = 3;
    dVar2 = *(double *)local_10[6];
    local_10[2] = dVar2;
    *local_10 = dVar2;
    dVar2 = *(double *)((long)local_10[6] + 8);
    local_10[3] = dVar2;
    local_10[1] = dVar2;
    while (iVar1 = local_14 + -1, local_14 != 0) {
      local_18 = local_14 + -2;
      if (local_18 < 0) {
        local_18 = 2;
      }
      if (*(double *)local_10[(long)iVar1 + 6] < *local_10) {
        *local_10 = *(double *)local_10[(long)iVar1 + 6];
      }
      if (local_10[2] <= *(double *)local_10[(long)iVar1 + 6] &&
          *(double *)local_10[(long)iVar1 + 6] != local_10[2]) {
        local_10[2] = *(double *)local_10[(long)iVar1 + 6];
      }
      local_14 = iVar1;
      if (((*(uint *)((long)local_10 + (long)iVar1 * 4 + 0x48) & 0x80) == 0) &&
         ((*(uint *)((long)local_10 + (long)local_18 * 4 + 0x48) & 0x80) == 0)) {
        if (*(double *)((long)local_10[(long)iVar1 + 6] + 8) < local_10[1]) {
          local_10[1] = *(double *)((long)local_10[(long)iVar1 + 6] + 8);
        }
        if (local_10[3] <= *(double *)((long)local_10[(long)iVar1 + 6] + 8) &&
            *(double *)((long)local_10[(long)iVar1 + 6] + 8) != local_10[3]) {
          local_10[3] = *(double *)((long)local_10[(long)iVar1 + 6] + 8);
        }
      }
      else {
        if (*(double *)((long)local_10[(long)iVar1 + 6] + 8) -
            (double)(*(uint *)((long)local_10 + (long)iVar1 * 4 + 0x48) & 0x7f) < local_10[1]) {
          local_10[1] = *(double *)((long)local_10[(long)iVar1 + 6] + 8) -
                        (double)(*(uint *)((long)local_10 + (long)iVar1 * 4 + 0x48) & 0x7f);
        }
        dVar2 = *(double *)((long)local_10[(long)iVar1 + 6] + 8) +
                (double)(*(uint *)((long)local_10 + (long)iVar1 * 4 + 0x48) & 0x7f);
        if (local_10[3] <= dVar2 && dVar2 != local_10[3]) {
          local_10[3] = *(double *)((long)local_10[(long)iVar1 + 6] + 8) +
                        (double)(*(uint *)((long)local_10 + (long)iVar1 * 4 + 0x48) & 0x7f);
        }
      }
    }
    AddTriangle(_lc,in_RDI);
  }
  return;
}

Assistant:

static void AddTriangles(struct Level *Lvl)
{
   struct Triangle *Tri = Lvl->AllTris;

   while (Tri) {
      int c = 3;

      /* determine axis aligned bounding box */
      Tri->Bounder.TL.Pos[0] = Tri->Bounder.BR.Pos[0] = Tri->Edges[0]->Pos[0];
      Tri->Bounder.TL.Pos[1] = Tri->Bounder.BR.Pos[1] = Tri->Edges[0]->Pos[1];

      while (c--) {
         int lc = c - 1;

         if (lc < 0)
            lc = 2;

         /* check if this x expands the bounding box either leftward or rightward */
         if (Tri->Edges[c]->Pos[0] < Tri->Bounder.TL.Pos[0])
            Tri->Bounder.TL.Pos[0] = Tri->Edges[c]->Pos[0];
         if (Tri->Edges[c]->Pos[0] > Tri->Bounder.BR.Pos[0])
            Tri->Bounder.BR.Pos[0] = Tri->Edges[c]->Pos[0];

         /* check y */
         if ((Tri->EdgeFlags[c] & TRIFLAGS_EDGE)
             || (Tri->EdgeFlags[lc] & TRIFLAGS_EDGE)) {
            if (Tri->Edges[c]->Pos[1] -
                (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH) < Tri->Bounder.TL.Pos[1])
               Tri->Bounder.TL.Pos[1] =
                  Tri->Edges[c]->Pos[1] -
                  (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH);
            if (Tri->Edges[c]->Pos[1] + (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH) >
                Tri->Bounder.BR.Pos[1])
               Tri->Bounder.BR.Pos[1] =
                  Tri->Edges[c]->Pos[1] +
                  (Tri->EdgeFlags[c] & TRIFLAGS_WIDTH);
         } else {
            if (Tri->Edges[c]->Pos[1] < Tri->Bounder.TL.Pos[1])
               Tri->Bounder.TL.Pos[1] = Tri->Edges[c]->Pos[1];
            if (Tri->Edges[c]->Pos[1] > Tri->Bounder.BR.Pos[1])
               Tri->Bounder.BR.Pos[1] = Tri->Edges[c]->Pos[1];
         }
      }

      /* insert into tree */
      AddTriangle(Lvl, Tri);

      /* move along linked list */
      Tri = Tri->Next;
   }
}